

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsComponentAddPartEntities
              (FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsIntType id_store_type,
              FmsIntType ent_id_type,FmsIntType orient_type,FmsOrientation *inv_orient_map,
              void *ents,void *ent_orients,FmsInt num_ents)

{
  ulong uVar1;
  void *__ptr;
  size_t sVar2;
  long *plVar3;
  FmsInt __size;
  void *pvVar4;
  uint in_ECX;
  uint in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  FmsInt nc;
  size_t sizeof_ent_ids;
  FmsOrientation *orientations;
  void *entities_ids;
  FmsInt num_entities;
  _FmsPart_private *part;
  FmsInt in_stack_000001e8;
  void *in_stack_000001f0;
  void *in_stack_000001f8;
  FmsIntType in_stack_00000204;
  void *in_stack_00000208;
  FmsIntType in_stack_00000210;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI < *(ulong *)(in_RDI + 0x20)) {
    if (in_EDX < 8) {
      if ((*(long *)(in_RDI + 0x10) == 0x7f) || (*(FmsInt *)(in_RDI + 0x10) == FmsEntityDim[in_EDX])
         ) {
        if (in_ECX < 8) {
          if (in_R8D < 8) {
            if (in_R9D < 8) {
              plVar3 = (long *)(*(long *)(in_RDI + 0x30) + in_RSI * 0xe8);
              uVar1 = plVar3[(ulong)in_EDX + 1];
              pvVar4 = (void *)plVar3[(ulong)in_EDX + 0xd];
              __ptr = (void *)plVar3[(ulong)in_EDX + 0x15];
              if (uVar1 == 0) {
                if ((orientations == (FmsOrientation *)0x0) &&
                   (num_entities != *(FmsInt *)(*plVar3 + (ulong)in_EDX * 8))) {
                  return 0xc;
                }
              }
              else {
                if (pvVar4 == (void *)0x0) {
                  return 7;
                }
                if (__ptr == (void *)0x0) {
                  return 8;
                }
                if (orientations == (FmsOrientation *)0x0) {
                  return 9;
                }
                if (entities_ids == (void *)0x0) {
                  return 10;
                }
                if (*(uint *)((long)plVar3 + (ulong)in_EDX * 4 + 0x48) != in_ECX) {
                  return 0xb;
                }
              }
              sVar2 = FmsIntTypeSize[in_ECX];
              if (num_entities != 0) {
                __size = NextPow2(uVar1 + num_entities);
                if (orientations != (FmsOrientation *)0x0) {
                  if (uVar1 <= __size >> 1) {
                    pvVar4 = realloc(pvVar4,__size * sVar2);
                    if (pvVar4 == (void *)0x0) {
                      return 0xd;
                    }
                    plVar3[(ulong)in_EDX + 0xd] = (long)pvVar4;
                  }
                  FmsIntConvertCopy(in_stack_00000210,in_stack_00000208,in_stack_00000204,
                                    in_stack_000001f8,(FmsInt)in_stack_000001f0);
                }
                if (entities_ids != (void *)0x0) {
                  if (uVar1 <= __size >> 1) {
                    pvVar4 = realloc(__ptr,__size);
                    if (pvVar4 == (void *)0x0) {
                      return 0xd;
                    }
                    plVar3[(ulong)in_EDX + 0x15] = (long)pvVar4;
                  }
                  if (sizeof_ent_ids == 0) {
                    FmsIntConvertCopy(in_stack_00000210,in_stack_00000208,in_stack_00000204,
                                      in_stack_000001f8,(FmsInt)in_stack_000001f0);
                  }
                  else {
                    FmsIntMapCopy(in_stack_00000210,in_stack_00000208,in_stack_00000204,
                                  in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
                  }
                }
              }
              plVar3[(ulong)in_EDX + 1] = uVar1 + num_entities;
              if (uVar1 == 0) {
                *(uint *)((long)plVar3 + (ulong)in_EDX * 4 + 0x48) = in_ECX;
              }
              if (*(long *)(in_RDI + 0x10) == 0x7f) {
                *(FmsInt *)(in_RDI + 0x10) = FmsEntityDim[in_EDX];
              }
              *(FmsInt *)(in_RDI + 0x18) = num_entities + *(long *)(in_RDI + 0x18);
              local_4 = 0;
            }
            else {
              local_4 = 6;
            }
          }
          else {
            local_4 = 5;
          }
        }
        else {
          local_4 = 4;
        }
      }
      else {
        local_4 = 3;
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsComponentAddPartEntities(FmsComponent comp, FmsInt part_id,
                                FmsEntityType type, FmsIntType id_store_type,
                                FmsIntType ent_id_type, FmsIntType orient_type,
                                const FmsOrientation *inv_orient_map,
                                const void *ents, const void *ent_orients,
                                FmsInt num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  if (comp->dim != FMS_INVALID_DIM && comp->dim != FmsEntityDim[type]) {
    E_RETURN(3);
  }
  if (id_store_type >= FMS_NUM_INT_TYPES) { E_RETURN(4); }
  if (ent_id_type >= FMS_NUM_INT_TYPES) { E_RETURN(5); }
  if (orient_type >= FMS_NUM_INT_TYPES) { E_RETURN(6); }
  struct _FmsPart_private *part = comp->parts + part_id;
  const FmsInt num_entities = part->num_entities[type];
  void *entities_ids = part->entities_ids[type];
  FmsOrientation *orientations = part->orientations[type];
  if (num_entities != 0) {
    if (entities_ids == NULL) { E_RETURN(7); }
    if (orientations == NULL) { E_RETURN(8); }
    if (ents == NULL) { E_RETURN(9); }
    if (ent_orients == NULL) { E_RETURN(10); }
    if (part->entities_ids_type[type] != id_store_type) { E_RETURN(11); }
  } else if (ents == NULL) {
    if (num_ents != part->domain->num_entities[type]) { E_RETURN(12); }
  }
  const size_t sizeof_ent_ids = FmsIntTypeSize[id_store_type];
  if (num_ents != 0) {
    const FmsInt nc = NextPow2(num_entities + num_ents);
    if (ents != NULL) {
      if (num_entities <= nc/2) {
        entities_ids = realloc(entities_ids, nc*sizeof_ent_ids);
        if (entities_ids == NULL) { E_RETURN(13); }
        part->entities_ids[type] = entities_ids;
      }
      FmsIntConvertCopy(ent_id_type, ents, id_store_type,
                        (char*)entities_ids + num_entities*sizeof_ent_ids,
                        num_ents);
    } else {
      // part->entities_ids[type] is already NULL since num_entities is 0
    }
    if (ent_orients != NULL) {
      if (num_entities <= nc/2) {
        orientations = realloc(orientations, nc*sizeof(FmsOrientation));
        if (orientations == NULL) { E_RETURN(13); }
        part->orientations[type] = orientations;
      }
      if (inv_orient_map != NULL) {
        FmsIntMapCopy(orient_type, ent_orients, FMS_ORIENTATION_INT_TYPE,
                      orientations + num_entities, inv_orient_map, num_ents);
      } else {
        FmsIntConvertCopy(orient_type, ent_orients, FMS_ORIENTATION_INT_TYPE,
                          orientations + num_entities, num_ents);
      }
    } else {
      // part->orientations[type] is already NULL since num_entities is 0
    }
  }
  // Update the part
  part->num_entities[type] = num_entities + num_ents;
  if (num_entities == 0) {
    part->entities_ids_type[type] = id_store_type;
  }
  // Update the component
  if (comp->dim == FMS_INVALID_DIM) {
    comp->dim = FmsEntityDim[type];
  }
  comp->num_main_entities += num_ents;
  return 0;
}